

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O2

int main(int argc,char **argv)

{
  uint8_t *data_00;
  char cVar1;
  uint32_t uVar2;
  uint3 uVar3;
  undefined8 uVar4;
  uint8_t *ptr;
  int iVar5;
  int iVar6;
  uint uVar7;
  VP8StatusCode VVar8;
  WebPInfoStatus WVar9;
  WebPInfoStatus WVar10;
  int iVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  char *pcVar15;
  uint32_t *puVar16;
  byte bVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  size_t sVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  uint *puVar26;
  byte *pbVar27;
  ulong uVar28;
  bool bVar29;
  uint64_t bit_position_1;
  ulong local_180;
  int update_map;
  int has_alpha;
  int a_delta;
  WebPInfo webp_info;
  int bit;
  int update_data;
  size_t size;
  ulong uStack_d0;
  int filter_strength [4];
  uint3 *local_b0;
  int local_98;
  int local_94;
  uint local_90;
  int local_8c;
  ulong local_88;
  int clamp_type;
  int colorspace;
  uint8_t *data;
  uint local_70;
  uint local_6c;
  int local_68;
  long local_40;
  char **local_38;
  
  local_38 = argv;
  if (argc != 1) {
    local_40 = (long)argc;
    local_8c = 0;
    local_94 = 0;
    local_98 = 0;
    local_90 = 0;
    for (lVar25 = 1; lVar25 < local_40; lVar25 = lVar25 + 1) {
      pcVar15 = local_38[lVar25];
      cVar1 = *pcVar15;
      if ((((((cVar1 == '-') && (pcVar15[1] == 'h')) && (pcVar15[2] == '\0')) ||
           (iVar5 = strcmp(pcVar15,"-help"), iVar5 == 0)) ||
          (((cVar1 == '-' && (pcVar15[1] == 'H')) && (pcVar15[2] == '\0')))) ||
         (iVar5 = strcmp(pcVar15,"-longhelp"), iVar5 == 0)) {
        Help();
        return 0;
      }
      iVar5 = strcmp(pcVar15,"-quiet");
      if (iVar5 == 0) {
        local_8c = 1;
      }
      else {
        iVar5 = strcmp(pcVar15,"-diag");
        if (iVar5 == 0) {
          local_94 = 1;
        }
        else {
          iVar5 = strcmp(pcVar15,"-summary");
          if (iVar5 == 0) {
            local_98 = 1;
          }
          else {
            iVar5 = strcmp(pcVar15,"-bitstream_info");
            if (iVar5 != 0) {
              iVar5 = strcmp(pcVar15,"-version");
              if (iVar5 == 0) {
                uVar23 = WebPGetDecoderVersion();
                printf("WebP Decoder version: %d.%d.%d\n",(ulong)(uVar23 >> 0x10 & 0xff),
                       (ulong)(uVar23 >> 8 & 0xff),(ulong)(uVar23 & 0xff));
                return 0;
              }
              break;
            }
            local_90 = 1;
          }
        }
      }
    }
    if (argc != (int)lVar25) {
      WVar9 = WEBP_INFO_OK;
      do {
        if (local_40 <= lVar25) {
          return (uint)(WVar9 != WEBP_INFO_OK);
        }
        webp_info.is_processing_anim_frame_ = 0;
        webp_info.seen_alpha_subchunk_ = 0;
        webp_info.frame_height_ = 0;
        webp_info._84_4_ = 0;
        webp_info.anim_frame_data_size_ = 0;
        webp_info.bgcolor_ = 0;
        webp_info.feature_flags_ = 0;
        webp_info.has_alpha_ = 0;
        webp_info.frame_width_ = 0;
        webp_info.chunk_counts_[8] = 0;
        webp_info.anmf_subchunk_counts_[0] = 0;
        webp_info.anmf_subchunk_counts_[1] = 0;
        webp_info.anmf_subchunk_counts_[2] = 0;
        webp_info.chunk_counts_[4] = 0;
        webp_info.chunk_counts_[5] = 0;
        webp_info.chunk_counts_[6] = 0;
        webp_info.chunk_counts_[7] = 0;
        webp_info.chunk_counts_[0] = 0;
        webp_info.chunk_counts_[1] = 0;
        webp_info.chunk_counts_[2] = 0;
        webp_info.chunk_counts_[3] = 0;
        webp_info.canvas_width_ = 0;
        webp_info.canvas_height_ = 0;
        webp_info.loop_count_ = 0;
        webp_info.num_frames_ = 0;
        webp_info.seen_image_subchunk_ = 0;
        iVar5 = webp_info.seen_image_subchunk_;
        webp_info.seen_image_subchunk_ = 0;
        webp_info.quiet_ = local_8c;
        webp_info.show_summary_ = local_98;
        webp_info.show_diagnosis_ = local_94;
        webp_info._120_8_ = (ulong)local_90 << 0x20;
        pcVar15 = local_38[lVar25];
        if ((pcVar15 == (char *)0x0) ||
           (iVar6 = ImgIoUtilReadFile(pcVar15,&data,&size), ptr = data, sVar22 = size,
           iVar5 = webp_info.seen_image_subchunk_, iVar6 == 0)) {
          webp_info.seen_image_subchunk_ = iVar5;
          fprintf(_stderr,"Failed to open input file %s.\n",pcVar15);
          WVar9 = WEBP_INFO_INVALID_COMMAND;
        }
        else {
          if (webp_info.quiet_ == 0) {
            printf("File: %s\n",pcVar15);
          }
          if (sVar22 < 0x14) {
            bVar29 = webp_info.show_diagnosis_ == 0;
            pcVar15 = "Truncated data detected when parsing RIFF header.";
LAB_001025d2:
            WVar9 = WEBP_INFO_TRUNCATED_DATA;
          }
          else {
            if ((*(int *)ptr == 0x46464952) && (*(int *)(ptr + 8) == 0x50424557)) {
              uVar23 = *(uint *)(ptr + 4);
              if ((ulong)uVar23 < 8) {
                bVar29 = webp_info.show_diagnosis_ == 0;
                pcVar15 = "RIFF size is too small.";
              }
              else {
                if (uVar23 < 0xfffffff7) {
                  uVar21 = (ulong)uVar23 + 8;
                  if (webp_info.quiet_ == 0) {
                    puts("RIFF HEADER:");
                    printf("  File size: %6d\n",uVar21 & 0xffffffff);
                  }
                  if (uVar21 < sVar22) {
                    if (webp_info.show_diagnosis_ != 0) {
                      fprintf(_stderr,"Warning: %s\n","RIFF size is smaller than the file size.");
                    }
                    webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                    sVar22 = uVar21;
LAB_00102703:
                    WVar9 = WEBP_INFO_OK;
                    local_88 = 0xc;
LAB_0010271a:
                    if (WVar9 == WEBP_INFO_OK) {
                      if (sVar22 == local_88) {
                        if (webp_info.show_summary_ != 0) {
                          puts("Summary:");
                          printf("Number of frames: %d\n",(ulong)webp_info._8_8_ >> 0x20);
                          puts(
                              "Chunk type  :  VP8 VP8L VP8X ALPH ANIM ANMF(VP8 /VP8L/ALPH) ICCP EXIF  XMP"
                              );
                          printf("Chunk counts: ");
                          for (lVar19 = 0; lVar19 != 9; lVar19 = lVar19 + 1) {
                            printf("%4d ",(ulong)(uint)webp_info.chunk_counts_[lVar19]);
                            if (lVar19 == 5) {
                              printf("%4d %4d %4d  ",(ulong)webp_info._48_8_ >> 0x20,
                                     webp_info.anmf_subchunk_counts_._4_8_ & 0xffffffff,
                                     (ulong)webp_info.anmf_subchunk_counts_._4_8_ >> 0x20);
                            }
                          }
                          putchar(10);
                        }
                        uVar4 = webp_info._64_8_;
                        if (webp_info.num_frames_ < 1) {
                          bVar29 = webp_info.show_diagnosis_ == 0;
                          pcVar15 = "No image/frame detected.";
                          goto LAB_00104671;
                        }
                        WVar9 = WEBP_INFO_OK;
                        if (webp_info.chunk_counts_[2] == 0) goto LAB_00102601;
                        iVar5 = webp_info.feature_flags_;
                        bVar17 = (byte)webp_info.feature_flags_;
                        if ((webp_info._64_8_ & 0x1000000000) == 0) {
                          if (webp_info.has_alpha_ == 0) goto LAB_001045fa;
                          bVar29 = webp_info.show_diagnosis_ == 0;
                          pcVar15 = "Unexpected alpha data detected.";
                          goto LAB_001025f8;
                        }
                        if (webp_info.has_alpha_ == 0) {
                          if (webp_info.show_diagnosis_ != 0) {
                            fprintf(_stderr,"Warning: %s\n",
                                    "Alpha flag is set with no alpha data present.");
                          }
                          webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                        }
LAB_001045fa:
                        if ((webp_info.chunk_counts_[6] == 0 & (byte)((uint)iVar5 >> 5) & 7) == 1) {
                          bVar29 = webp_info.show_diagnosis_ == 0;
                          pcVar15 = "Missing ICCP chunk.";
LAB_00104671:
                          WVar9 = WEBP_INFO_MISSING_DATA;
                          goto LAB_001025fa;
                        }
                        if ((webp_info.chunk_counts_[7] == 0 & bVar17 >> 3) == 1) {
                          bVar29 = webp_info.show_diagnosis_ == 0;
                          pcVar15 = "Missing EXIF chunk.";
                          goto LAB_00104671;
                        }
                        if ((webp_info.chunk_counts_[8] == 0 & bVar17 >> 2) == 1) {
                          bVar29 = webp_info.show_diagnosis_ == 0;
                          pcVar15 = "Missing XMP chunk.";
                          goto LAB_00104671;
                        }
                        if ((char)((iVar5 & 0x20U) >> 5) == '\0' && webp_info.chunk_counts_[6] != 0)
                        {
                          bVar29 = webp_info.show_diagnosis_ == 0;
                          pcVar15 = "Unexpected ICCP chunk detected.";
                          goto LAB_001025f8;
                        }
                        if ((char)((iVar5 & 8U) >> 3) == '\0' && webp_info.chunk_counts_[7] != 0) {
                          bVar29 = webp_info.show_diagnosis_ == 0;
                          pcVar15 = "Unexpected EXIF chunk detected.";
                          goto LAB_001025f8;
                        }
                        if ((char)((iVar5 & 4U) >> 2) == '\0' && webp_info.chunk_counts_[8] != 0) {
                          pcVar15 = "Unexpected XMP chunk detected.";
                          WVar9 = WEBP_INFO_PARSE_ERROR;
                          if (webp_info.show_diagnosis_ == 0) goto LAB_00102601;
                          goto LAB_00104535;
                        }
                        WVar9 = WEBP_INFO_MISSING_DATA;
                        if (webp_info.is_processing_anim_frame_ == 0) {
                          if ((uVar4 & 0x200000000) != 0) {
                            if (webp_info.chunk_counts_[4] != 0) {
                              WVar9 = WEBP_INFO_OK;
                              if (webp_info.chunk_counts_[5] != 0) goto LAB_00102601;
                            }
                            bVar29 = webp_info.show_diagnosis_ == 0;
                            pcVar15 = "No ANIM/ANMF chunk detected in animation file.";
                            goto LAB_001025f8;
                          }
                          WVar9 = WEBP_INFO_OK;
                          if (1 < webp_info.num_frames_) {
                            bVar29 = webp_info.show_diagnosis_ == 0;
                            pcVar15 = "More than 1 frame detected in non-animation file.";
                            goto LAB_001025f8;
                          }
                        }
                        goto LAB_00102601;
                      }
                      if (sVar22 - local_88 < 8) {
                        bVar29 = webp_info.show_diagnosis_ == 0;
                        pcVar15 = "Truncated data detected when parsing chunk header.";
                        goto LAB_001025d2;
                      }
                      uVar23 = *(uint *)(ptr + local_88 + 4);
                      if (0xfffffff6 < uVar23) {
                        bVar29 = webp_info.show_diagnosis_ == 0;
                        pcVar15 = "Size of chunk payload is over limit.";
                        WVar9 = WEBP_INFO_INVALID_PARAM;
                        goto LAB_001025fa;
                      }
                      lVar19 = local_88 + 8;
                      uVar7 = uVar23 & 1;
                      uVar21 = (ulong)(uVar7 + uVar23);
                      if (uVar21 <= sVar22 - lVar19) {
                        data_00 = ptr + local_88;
                        uVar23 = uVar7 + uVar23 + 8;
                        uVar14 = (ulong)uVar23;
                        puVar16 = kWebPChunkTags;
                        uVar28 = 0;
LAB_00102785:
                        if (uVar28 != 9) {
                          if (*puVar16 != *(uint32_t *)(ptr + local_88)) goto code_r0x0010278f;
                          if (uVar28 == 5) {
                            if (uVar7 != 0) {
                              pcVar15 = "ANMF chunk size should always be even.";
                              WVar9 = WEBP_INFO_PARSE_ERROR;
                              goto LAB_00104529;
                            }
                            uVar21 = local_88 + 0x18;
                            uVar28 = 5;
                          }
                          else {
                            uVar21 = uVar21 + lVar19;
                          }
                          uVar7 = (uint)uVar28;
                          uVar28 = uVar28 & 0xffffffff;
                          if (webp_info.quiet_ == 0) {
                            uVar2 = kWebPChunkTags[uVar28];
                            printf("Chunk %c%c%c%c at offset %6d, length %6d\n",
                                   (ulong)(uint)(int)(char)uVar2,
                                   (ulong)(uint)(int)(char)(uVar2 >> 8),
                                   (ulong)(uint)(int)(char)(uVar2 >> 0x10),
                                   (ulong)(uint)((int)uVar2 >> 0x18),local_88,uVar23);
                          }
                          WVar9 = WEBP_INFO_OK;
                          local_88 = uVar21;
                          if (8 < uVar7) goto LAB_0010321a;
                          puVar26 = (uint *)(ptr + lVar19);
                          switch(uVar28) {
                          default:
                            local_180 = uVar14;
                            VVar8 = WebPGetFeaturesInternal
                                              (data_00,uVar14,(WebPBitstreamFeatures *)&data,0x209);
                            if (VVar8 != VP8_STATUS_OK) {
                              WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                              uVar14 = local_180;
                              if (webp_info.show_diagnosis_ != 0) {
                                fprintf(_stderr,"Error: %s\n","VP8/VP8L bitstream error.");
                                WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                uVar14 = local_180;
                              }
                              goto LAB_0010321a;
                            }
                            if (webp_info.quiet_ == 0) {
                              printf("  Width: %d\n  Height: %d\n  Alpha: %d\n  Animation: %d\n  Format: %s (%d)\n"
                                     ,(ulong)data & 0xffffffff,(ulong)data >> 0x20,(ulong)local_70,
                                     (ulong)local_6c,
                                     kFormats_rel + *(int *)(kFormats_rel + (long)local_68 * 4),
                                     local_68);
                            }
                            uVar14 = local_180;
                            if (webp_info.is_processing_anim_frame_ == 0) {
                              if (webp_info.chunk_counts_[1] == 0 && webp_info.chunk_counts_[0] == 0
                                 ) {
                                if ((uVar7 == 1) && (webp_info.chunk_counts_[3] != 0)) {
                                  if (webp_info.show_diagnosis_ != 0) {
                                    fprintf(_stderr,"Warning: %s\n",
                                            "Both VP8L and ALPH chunks are detected.");
                                  }
                                  webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                                }
                                uVar14 = local_180;
                                if (webp_info.chunk_counts_[5] == 0 &&
                                    webp_info.chunk_counts_[4] == 0) {
                                  if (webp_info.chunk_counts_[2] == 0) {
                                    webp_info._0_8_ = data;
                                    if ((((int)data + 0xfeffffffU < 0xff000000) ||
                                        (data._4_4_ + 0xfeffffff < 0xff000000)) ||
                                       (0x100000000 < (ulong)data._4_4_ * ((ulong)data & 0xffffffff)
                                       )) {
                                      if (webp_info.show_diagnosis_ != 0) {
                                        fprintf(_stderr,"Warning: %s\n",
                                                "Invalid parameters in VP8/VP8L chunk.");
                                      }
                                      webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                                    }
                                  }
                                  else if ((webp_info.canvas_width_ != (int)data) ||
                                          (webp_info.canvas_height_ != data._4_4_)) {
                                    WVar9 = WEBP_INFO_PARSE_ERROR;
                                    if (webp_info.show_diagnosis_ != 0) {
                                      pcVar15 = 
                                      "Image size in VP8/VP8L chunk differs from VP8X chunk.";
                                      goto LAB_00103165;
                                    }
                                    goto LAB_0010321a;
                                  }
                                  webp_info.chunk_counts_[uVar28] =
                                       webp_info.chunk_counts_[uVar28] + 1;
LAB_001033b6:
                                  webp_info.num_frames_ = webp_info.num_frames_ + 1;
                                  webp_info.has_alpha_ = webp_info.has_alpha_ | local_70;
                                  if (webp_info.parse_bitstream_ == 0) goto LAB_00103d1c;
                                  if (uVar7 != 0) {
                                    uVar21 = local_180 - 8;
                                    size = 0;
                                    puts("  Parsing lossless bitstream...");
                                    if (uVar21 < 5) {
                                      WVar9 = WEBP_INFO_TRUNCATED_DATA;
                                      if (webp_info.show_diagnosis_ == 0) goto LAB_00103d0a;
LAB_00103d23:
                                      fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.")
                                      ;
                                    }
                                    else {
                                      if ((byte)*puVar26 != 0x2f) {
                                        WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                        if (webp_info.show_diagnosis_ != 0) {
                                          fprintf(_stderr,"Error: %s\n",
                                                  "Invalid lossless bitstream signature.");
                                          WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                        }
                                        goto LAB_00103d0a;
                                      }
                                      pbVar27 = (byte *)((long)puVar26 + 1);
                                      sVar12 = local_180 - 9;
                                      iVar5 = LLGetBits(pbVar27,sVar12,0xe,filter_strength,&size);
                                      if ((((iVar5 != 0) &&
                                           (iVar5 = LLGetBits(pbVar27,sVar12,0xe,
                                                              (int *)&bit_position_1,&size),
                                           iVar5 != 0)) &&
                                          (iVar5 = LLGetBits(pbVar27,sVar12,1,&has_alpha,&size),
                                          iVar5 != 0)) &&
                                         (iVar5 = LLGetBits(pbVar27,sVar12,3,&update_map,&size),
                                         iVar5 != 0)) {
                                        uVar23 = (int)bit_position_1 + 1;
                                        printf("  Width:            %d\n",
                                               (ulong)(filter_strength[0] + 1));
                                        printf("  Height:           %d\n",(ulong)uVar23);
                                        printf("  Alpha:            %d\n",(ulong)(uint)has_alpha);
                                        printf("  Version:          %d\n",(ulong)(uint)update_map);
                                        WVar9 = ParseLosslessTransform
                                                          (&webp_info,pbVar27,sVar12,&size);
                                        goto LAB_00103d0a;
                                      }
                                      if (webp_info.show_diagnosis_ != 0) goto LAB_00103d23;
                                    }
                                    WVar9 = WEBP_INFO_TRUNCATED_DATA;
                                    goto LAB_00103d0a;
                                  }
                                  bVar17 = (byte)*puVar26;
                                  uVar23 = *puVar26;
                                  uVar20 = bVar17 >> 1 & 7;
                                  bit_position_1 = 0;
                                  puts("  Parsing lossy bitstream...");
                                  if (uVar20 < 4) {
                                    if ((bVar17 & 0x10) == 0) {
                                      WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                      if (webp_info.show_diagnosis_ == 0) goto LAB_00103d0a;
                                      pcVar15 = "Frame is not displayable.";
                                    }
                                    else {
                                      uVar23 = (uint)(uint3)((uint3)uVar23 >> 5);
                                      pcVar15 = "No";
                                      if ((bVar17 & 1) == 0) {
                                        pcVar15 = "Yes";
                                      }
                                      printf("  Key frame:        %s\n  Profile:          %d\n  Display:          Yes\n  Part. 0 length:   %d\n"
                                             ,pcVar15,(ulong)uVar20,(ulong)uVar23);
                                      if ((bVar17 & 1) == 0) {
                                        if (((*(byte *)((long)puVar26 + 3) == 0x9d) &&
                                            ((byte)puVar26[1] == 1)) &&
                                           (*(byte *)((long)puVar26 + 5) == 0x2a)) {
                                          printf("  Width:            %d\n  X scale:          %d\n  Height:           %d\n  Y scale:          %d\n"
                                                 ,(ulong)((*(byte *)((long)puVar26 + 7) & 0x3f) << 8
                                                         | (uint)*(byte *)((long)puVar26 + 6)),
                                                 (ulong)(*(byte *)((long)puVar26 + 7) >> 6),
                                                 (ulong)((*(byte *)((long)puVar26 + 9) & 0x3f) << 8
                                                        | (uint)(byte)puVar26[2]),
                                                 (ulong)(*(byte *)((long)puVar26 + 9) >> 6));
                                          uVar21 = local_180 - 0x12;
                                          uVar14 = (ulong)uVar23;
                                          lVar19 = uVar21 - uVar14;
                                          if (uVar14 <= uVar21 && lVar19 != 0) {
                                            pbVar27 = (byte *)((long)puVar26 + 10);
                                            iVar5 = GetBits(pbVar27,uVar21,1,&colorspace,
                                                            &bit_position_1);
                                            if ((iVar5 == 0) ||
                                               (iVar5 = GetBits(pbVar27,uVar21,1,&clamp_type,
                                                                &bit_position_1), iVar5 == 0))
                                            goto LAB_0010440a;
                                            printf("  Color space:      %d\n",
                                                   (ulong)(uint)colorspace);
                                            printf("  Clamp type:       %d\n",
                                                   (ulong)(uint)clamp_type);
                                            iVar6 = GetBits(pbVar27,uVar21,1,&has_alpha,
                                                            &bit_position_1);
                                            iVar5 = has_alpha;
                                            if (iVar6 == 0) goto LAB_0010441d;
                                            printf("  Use segment:      %d\n",(ulong)(uint)has_alpha
                                                  );
                                            if (iVar5 == 0) goto LAB_00103f64;
                                            iVar5 = GetBits(pbVar27,uVar21,1,&update_map,
                                                            &bit_position_1);
                                            if ((iVar5 == 0) ||
                                               (iVar11 = GetBits(pbVar27,uVar21,1,&update_data,
                                                                 &bit_position_1),
                                               iVar6 = update_data, iVar5 = update_map, iVar11 == 0)
                                               ) goto LAB_0010441d;
                                            printf(
                                                  "  Update map:       %d\n  Update data:      %d\n"
                                                  ,(ulong)(uint)update_map,(ulong)(uint)update_data)
                                            ;
                                            if (iVar6 == 0) goto LAB_00103eb5;
                                            size = 0;
                                            uStack_d0 = 0;
                                            filter_strength[0] = 0;
                                            filter_strength[1] = 0;
                                            filter_strength[2] = 0;
                                            filter_strength[3] = 0;
                                            iVar6 = GetBits(pbVar27,uVar21,1,&a_delta,
                                                            &bit_position_1);
                                            if (iVar6 == 0) goto LAB_0010441d;
                                            printf("  Absolute delta:   %d\n",(ulong)(uint)a_delta);
                                            lVar18 = 0;
                                            goto LAB_00103b59;
                                          }
                                          WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                          if (webp_info.show_diagnosis_ == 0) goto LAB_00103d0a;
                                          pcVar15 = "Bad partition length.";
                                        }
                                        else {
                                          WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                          if (webp_info.show_diagnosis_ == 0) goto LAB_00103d0a;
                                          pcVar15 = "Invalid lossy bitstream signature.";
                                        }
                                      }
                                      else {
                                        WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                        if (webp_info.show_diagnosis_ == 0) goto LAB_00103d0a;
                                        pcVar15 = "Non-keyframe detected in lossy bitstream.";
                                      }
                                    }
                                  }
                                  else {
                                    WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                    if (webp_info.show_diagnosis_ == 0) goto LAB_00103d0a;
                                    pcVar15 = "Unknown profile.";
                                  }
                                  fprintf(_stderr,"Error: %s\n",pcVar15);
                                  WVar9 = WEBP_INFO_BITSTREAM_ERROR;
                                  goto LAB_00103d0a;
                                }
                                WVar9 = WEBP_INFO_PARSE_ERROR;
                                if (webp_info.show_diagnosis_ == 0) goto LAB_0010321a;
                                pcVar15 = "VP8/VP8L chunk and ANIM/ANMF chunk are both detected.";
                              }
                              else {
                                WVar9 = WEBP_INFO_PARSE_ERROR;
                                if (webp_info.show_diagnosis_ == 0) goto LAB_0010321a;
                                pcVar15 = "Multiple VP8/VP8L chunks detected.";
                              }
                            }
                            else {
                              webp_info.anmf_subchunk_counts_[uVar7 != 0] =
                                   webp_info.anmf_subchunk_counts_[uVar7 != 0] + 1;
                              if ((uVar7 == 1) && (webp_info.seen_alpha_subchunk_ != 0)) {
                                WVar9 = WEBP_INFO_PARSE_ERROR;
                                if (webp_info.show_diagnosis_ == 0) goto LAB_0010321a;
                                pcVar15 = 
                                "Both VP8L and ALPH sub-chunks are present in an ANMF chunk.";
                              }
                              else {
                                if (webp_info.frame_width_ == (int)data) {
                                  if (webp_info.frame_height_ == data._4_4_) {
                                    if (webp_info.seen_image_subchunk_ == 0) {
                                      webp_info.seen_image_subchunk_ = 1;
                                      goto LAB_001033b6;
                                    }
                                    WVar9 = WEBP_INFO_PARSE_ERROR;
                                    if (webp_info.show_diagnosis_ != 0) {
                                      pcVar15 = "Consecutive VP8/VP8L sub-chunks in an ANMF chunk.";
                                      goto LAB_00103165;
                                    }
                                    goto LAB_0010321a;
                                  }
                                }
                                WVar9 = WEBP_INFO_PARSE_ERROR;
                                if (webp_info.show_diagnosis_ == 0) goto LAB_0010321a;
                                pcVar15 = 
                                "Frame size in VP8/VP8L sub-chunk differs from ANMF header.";
                              }
                            }
LAB_00103165:
                            fprintf(_stderr,"Error: %s\n",pcVar15);
                            uVar14 = local_180;
                            break;
                          case 2:
                            if (((webp_info.chunk_counts_[0] == 0) &&
                                (webp_info.chunk_counts_[1] == 0)) &&
                               (webp_info.chunk_counts_[2] == 0)) {
                              if (uVar23 == 0x12) {
                                webp_info.chunk_counts_[2] = 1;
                                bVar17 = (byte)*puVar26;
                                webp_info.feature_flags_._0_1_ = bVar17;
                                webp_info.feature_flags_._1_3_ = 0;
                                webp_info.canvas_height_ =
                                     (uint)*(ushort *)((long)puVar26 + 7) +
                                     (uint)*(byte *)((long)puVar26 + 9) * 0x10000 + 1;
                                webp_info.canvas_width_ =
                                     (uint)(ushort)puVar26[1] +
                                     (uint)*(byte *)((long)puVar26 + 6) * 0x10000 + 1;
                                iVar5 = webp_info.canvas_height_;
                                if (webp_info.quiet_ == 0) {
                                  printf("  ICCP: %d\n  Alpha: %d\n  EXIF: %d\n  XMP: %d\n  Animation: %d\n"
                                         ,(ulong)(bVar17 >> 5 & 1),(ulong)(bVar17 >> 4 & 1),
                                         (ulong)(bVar17 >> 3 & 1),(ulong)(bVar17 >> 2 & 1),
                                         (ulong)(bVar17 >> 1 & 1));
                                  printf("  Canvas size %d x %d\n",webp_info._0_8_ & 0xffffffff,
                                         (ulong)webp_info._0_8_ >> 0x20);
                                  if (0x1000000 < webp_info.canvas_width_) {
                                    if (webp_info.show_diagnosis_ != 0) {
                                      fprintf(_stderr,"Warning: %s\n",
                                              "Canvas width is out of range in VP8X chunk.");
                                    }
                                    webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                                  }
                                  iVar5 = webp_info.canvas_height_;
                                  if (0x1000000 < webp_info.canvas_height_) {
                                    if (webp_info.show_diagnosis_ != 0) {
                                      fprintf(_stderr,"Warning: %s\n",
                                              "Canvas height is out of range in VP8X chunk.");
                                    }
                                    webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                                    iVar5 = webp_info.canvas_height_;
                                  }
                                }
                                if (0x100000000 <
                                    (ulong)((long)iVar5 * (long)webp_info.canvas_width_)) {
                                  if (webp_info.show_diagnosis_ != 0) {
                                    fprintf(_stderr,"Warning: %s\n",
                                            "Canvas area is out of range in VP8X chunk.");
                                  }
                                  webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                                }
                                uVar7 = 2;
                              }
                              else {
                                if (webp_info.show_diagnosis_ != 0) {
                                  fprintf(_stderr,"Error: %s\n","Corrupted VP8X chunk.");
                                }
                                WVar9 = WEBP_INFO_PARSE_ERROR;
                                uVar7 = 2;
                              }
                            }
                            else {
                              if (webp_info.show_diagnosis_ != 0) {
                                fprintf(_stderr,"Error: %s\n",
                                        "Already seen a VP8/VP8L/VP8X chunk when parsing VP8X chunk."
                                       );
                              }
                              WVar9 = WEBP_INFO_PARSE_ERROR;
                              uVar7 = 2;
                            }
                            goto LAB_0010321a;
                          case 3:
                            if (webp_info.is_processing_anim_frame_ == 0) {
                              if (webp_info.chunk_counts_[5] == 0 && webp_info.chunk_counts_[4] == 0
                                 ) {
                                if (webp_info.chunk_counts_[2] == 0) {
                                  if (webp_info.show_diagnosis_ != 0) {
                                    pcVar15 = "ALPHA chunk detected before VP8X chunk.";
                                    goto LAB_001031fc;
                                  }
                                }
                                else if (webp_info.chunk_counts_[0] == 0) {
                                  if (webp_info.chunk_counts_[3] == 0) {
                                    webp_info.chunk_counts_[3] = 1;
                                    goto LAB_00103474;
                                  }
                                  if (webp_info.show_diagnosis_ != 0) {
                                    pcVar15 = "Multiple ALPHA chunks detected.";
                                    goto LAB_001031fc;
                                  }
                                }
                                else if (webp_info.show_diagnosis_ != 0) {
                                  pcVar15 = "ALPHA chunk detected after VP8 chunk.";
                                  goto LAB_001031fc;
                                }
                              }
                              else if (webp_info.show_diagnosis_ != 0) {
                                pcVar15 = "ALPHA chunk and ANIM/ANMF chunk are both detected.";
LAB_001031fc:
                                fprintf(_stderr,"Error: %s\n",pcVar15);
                              }
                            }
                            else {
                              webp_info.anmf_subchunk_counts_[2] =
                                   webp_info.anmf_subchunk_counts_[2] + 1;
                              if (webp_info.seen_alpha_subchunk_ == 0) {
                                webp_info.seen_alpha_subchunk_ = 1;
                                if (webp_info.seen_image_subchunk_ != 0) {
                                  if (webp_info.show_diagnosis_ != 0) {
                                    fprintf(_stderr,"Error: %s\n",
                                            "ALPHA sub-chunk detected after VP8 sub-chunk in an ANMF chunk."
                                           );
                                  }
                                  uVar7 = 3;
                                  goto LAB_00102d7f;
                                }
LAB_00103474:
                                webp_info.has_alpha_ = 1;
                                if (webp_info.parse_bitstream_ == 0) {
                                  uVar7 = 3;
                                }
                                else if ((uVar23 & 0xfffffffe) == 8) {
                                  if (webp_info.show_diagnosis_ != 0) {
                                    fprintf(_stderr,"Error: %s\n","Truncated ALPH chunk.");
                                  }
                                  uVar7 = 3;
                                  WVar9 = WEBP_INFO_TRUNCATED_DATA;
                                }
                                else {
                                  local_180 = uVar14;
                                  puts("  Parsing ALPH chunk...");
                                  bVar17 = (byte)*puVar26;
                                  uVar23 = bVar17 & 3;
                                  uVar21 = (ulong)(bVar17 >> 2 & 3);
                                  uVar7 = bVar17 >> 4 & 3;
                                  printf("  Compression:      %d\n",(ulong)(bVar17 & 3));
                                  printf("  Filter:           %s (%d)\n",
                                         kAlphaFilterMethods_rel +
                                         *(int *)(kAlphaFilterMethods_rel + uVar21 * 4),uVar21);
                                  printf("  Pre-processing:   %d\n",(ulong)uVar7);
                                  if (uVar23 < 2) {
                                    if (uVar7 < 2) {
                                      if (0x3f < bVar17) {
                                        if (webp_info.show_diagnosis_ != 0) {
                                          fprintf(_stderr,"Warning: %s\n",
                                                  "Reserved bits in ALPH chunk header are not all 0."
                                                 );
                                        }
                                        webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                                      }
                                      if (uVar23 == 1) {
                                        data = (uint8_t *)0x0;
                                        WVar10 = ParseLosslessTransform
                                                           (&webp_info,(byte *)((long)puVar26 + 1),
                                                            local_180 - 9,(uint64_t *)&data);
                                        if (WVar10 != WEBP_INFO_OK) goto LAB_001038ed;
                                      }
                                      WVar10 = WVar9;
                                    }
                                    else {
                                      if (webp_info.show_diagnosis_ != 0) {
                                        fprintf(_stderr,"Error: %s\n",
                                                "Invalid Alpha pre-processing method.");
                                      }
                                      WVar10 = WEBP_INFO_BITSTREAM_ERROR;
                                    }
                                  }
                                  else {
                                    if (webp_info.show_diagnosis_ != 0) {
                                      fprintf(_stderr,"Error: %s\n",
                                              "Invalid Alpha compression method.");
                                    }
                                    WVar10 = WEBP_INFO_BITSTREAM_ERROR;
                                  }
LAB_001038ed:
                                  WVar9 = WVar10;
                                  uVar7 = 3;
                                  uVar14 = local_180;
                                }
                                goto LAB_0010321a;
                              }
                              if (webp_info.show_diagnosis_ != 0) {
                                pcVar15 = "Consecutive ALPH sub-chunks in an ANMF chunk.";
                                goto LAB_001031fc;
                              }
                            }
                            uVar7 = 3;
                            break;
                          case 4:
                            if (webp_info.chunk_counts_[2] == 0) {
                              if (webp_info.show_diagnosis_ != 0) {
                                fprintf(_stderr,"Error: %s\n",
                                        "ANIM chunk detected before VP8X chunk.");
                              }
                              uVar7 = 4;
LAB_00102c79:
                              WVar9 = WEBP_INFO_PARSE_ERROR;
                            }
                            else {
                              if (uVar23 != 0xe) {
                                if (webp_info.show_diagnosis_ != 0) {
                                  fprintf(_stderr,"Error: %s\n","Corrupted ANIM chunk.");
                                }
                                uVar7 = 4;
                                goto LAB_00102d7f;
                              }
                              uVar23 = *puVar26;
                              webp_info.bgcolor_ = uVar23;
                              webp_info.loop_count_ = (uint)(ushort)puVar26[1];
                              webp_info.chunk_counts_[4] = webp_info.chunk_counts_[4] + 1;
                              if (webp_info.quiet_ == 0) {
                                WVar9 = WEBP_INFO_OK;
                                local_180 = uVar14;
                                printf("  Background color:(ARGB) %02x %02x %02x %02x\n",
                                       (ulong)(uVar23 >> 0x18),(ulong)(uVar23 >> 0x10 & 0xff),
                                       (ulong)(uVar23 >> 8 & 0xff),(ulong)(uVar23 & 0xff));
                                printf("  Loop count      : %d\n",webp_info._8_8_ & 0xffffffff);
                                if (0x10000 < webp_info.loop_count_) {
                                  if (webp_info.show_diagnosis_ != 0) {
                                    fprintf(_stderr,"Warning: %s\n",
                                            "Loop count is out of range in ANIM chunk.");
                                  }
                                  webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                                }
                                uVar7 = 4;
                                uVar14 = local_180;
                              }
                              else {
                                uVar7 = 4;
                              }
                            }
                            goto LAB_0010321a;
                          case 5:
                            if (webp_info.is_processing_anim_frame_ != 0) {
                              if (webp_info.show_diagnosis_ != 0) {
                                fprintf(_stderr,"Error: %s\n",
                                        "ANMF chunk detected within another ANMF chunk.");
                              }
                              uVar7 = 5;
                              goto LAB_00102c79;
                            }
                            if (webp_info.chunk_counts_[4] != 0) {
                              if (uVar23 < 0x19) {
                                if (webp_info.show_diagnosis_ != 0) {
                                  fprintf(_stderr,"Error: %s\n",
                                          "Truncated data detected when parsing ANMF chunk.");
                                }
                                uVar7 = 5;
                                WVar9 = WEBP_INFO_TRUNCATED_DATA;
                              }
                              else {
                                uVar20 = *puVar26;
                                uVar23 = (uint)(uint3)uVar20 * 2;
                                uVar3 = *(uint3 *)((long)puVar26 + 3);
                                uVar13 = (uint)(byte)puVar26[2] * 0x10000 +
                                         (uint)*(ushort *)((long)puVar26 + 6) + 1;
                                webp_info.chunk_counts_[5] = webp_info.chunk_counts_[5] + 1;
                                uVar24 = (uint)*(byte *)((long)puVar26 + 0xb) * 0x10000 +
                                         (uint)*(ushort *)((long)puVar26 + 9) + 1;
                                uVar7 = (uint)uVar3 * 2;
                                if (webp_info.quiet_ == 0) {
                                  local_180 = uVar14;
                                  printf("  Offset_X: %d\n  Offset_Y: %d\n  Width: %d\n  Height: %d\n  Duration: %d\n  Dispose: %d\n  Blend: %d\n"
                                         ,(ulong)uVar23,(ulong)uVar7,(ulong)uVar13,(ulong)uVar24,
                                         (ulong)(uint3)puVar26[3],*(byte *)((long)puVar26 + 0xf) & 1
                                         ,*(byte *)((long)puVar26 + 0xf) >> 1 & 1);
                                  uVar14 = local_180;
                                }
                                if (((uint3)uVar20 < 0x800001) && (uVar3 < 0x800001)) {
                                  if (((uint)webp_info.canvas_width_ < uVar23 + uVar13) ||
                                     ((uint)webp_info.canvas_height_ < uVar7 + uVar24)) {
                                    if (webp_info.show_diagnosis_ != 0) {
                                      fprintf(_stderr,"Error: %s\n",
                                              "Frame exceeds canvas in ANMF chunk.");
                                    }
                                    uVar7 = 5;
                                    WVar9 = WEBP_INFO_INVALID_PARAM;
                                  }
                                  else {
                                    webp_info.is_processing_anim_frame_ = 1;
                                    webp_info.seen_alpha_subchunk_ = 0;
                                    webp_info.seen_image_subchunk_ = 0;
                                    webp_info.frame_width_ = uVar13;
                                    webp_info.frame_height_ = uVar24;
                                    webp_info.anim_frame_data_size_ = uVar14 - 0x18;
                                    uVar7 = 5;
                                  }
                                }
                                else if (webp_info.show_diagnosis_ == 0) {
                                  uVar7 = 5;
                                  WVar9 = WEBP_INFO_INVALID_PARAM;
                                }
                                else {
                                  fprintf(_stderr,"Error: %s\n",
                                          "Invalid offset parameters in ANMF chunk.");
                                  uVar7 = 5;
                                  WVar9 = WEBP_INFO_INVALID_PARAM;
                                }
                              }
                              goto LAB_0010321a;
                            }
                            if (webp_info.show_diagnosis_ != 0) {
                              fprintf(_stderr,"Error: %s\n","ANMF chunk detected before ANIM chunk."
                                     );
                            }
                            uVar7 = 5;
                            break;
                          case 6:
                            if (webp_info.chunk_counts_[2] == 0) {
                              if (webp_info.show_diagnosis_ != 0) {
                                pcVar15 = "ICCP chunk detected before VP8X chunk.";
                                goto LAB_00103457;
                              }
                            }
                            else {
                              if (((webp_info.chunk_counts_[0] == 0) &&
                                  (webp_info.chunk_counts_[1] == 0)) &&
                                 (webp_info.chunk_counts_[4] == 0)) {
                                webp_info.chunk_counts_[6] = webp_info.chunk_counts_[6] + 1;
                                uVar7 = 6;
                                goto LAB_0010321a;
                              }
                              if (webp_info.show_diagnosis_ != 0) {
                                pcVar15 = "ICCP chunk detected after image data.";
LAB_00103457:
                                fprintf(_stderr,"Error: %s\n",pcVar15);
                              }
                            }
                            uVar7 = 6;
LAB_00102d7f:
                            WVar9 = WEBP_INFO_PARSE_ERROR;
                            goto LAB_0010321a;
                          case 7:
                          case 8:
                            webp_info.chunk_counts_[uVar28] = webp_info.chunk_counts_[uVar28] + 1;
                            goto LAB_0010321a;
                          }
                          WVar9 = WEBP_INFO_PARSE_ERROR;
                          goto LAB_0010321a;
                        }
                        snprintf((char *)&data,0x32,"Unknown chunk at offset %6d, length %6d",
                                 local_88 & 0xffffffff,uVar14);
                        if (webp_info.show_diagnosis_ != 0) {
                          fprintf(_stderr,"Warning: %s\n",&data);
                        }
                        webp_info.num_warnings_ = webp_info.num_warnings_ + 1;
                        WVar9 = WEBP_INFO_OK;
                        uVar7 = 9;
                        local_88 = uVar21 + lVar19;
                        goto LAB_0010321a;
                      }
                      pcVar15 = "Truncated data detected when parsing chunk payload.";
                      WVar9 = WEBP_INFO_TRUNCATED_DATA;
LAB_00104529:
                      if (webp_info.show_diagnosis_ != 0) goto LAB_00104535;
                    }
                    goto LAB_00102601;
                  }
                  if (uVar21 <= sVar22) goto LAB_00102703;
                  bVar29 = webp_info.show_diagnosis_ == 0;
                  pcVar15 = "Truncated data detected when parsing RIFF payload.";
                  goto LAB_001025d2;
                }
                bVar29 = webp_info.show_diagnosis_ == 0;
                pcVar15 = "RIFF size is over limit.";
              }
            }
            else {
              bVar29 = webp_info.show_diagnosis_ == 0;
              pcVar15 = "Corrupted RIFF header.";
            }
LAB_001025f8:
            WVar9 = WEBP_INFO_PARSE_ERROR;
          }
LAB_001025fa:
          if (!bVar29) {
LAB_00104535:
            fprintf(_stderr,"Error: %s\n",pcVar15);
          }
LAB_00102601:
          if (webp_info.quiet_ == 0) {
            pcVar15 = "Errors detected.";
            if (WVar9 == WEBP_INFO_OK) {
              pcVar15 = "No error detected.";
            }
            puts(pcVar15);
            if (0 < webp_info.num_warnings_) {
              printf("There were %d warning(s).\n");
            }
          }
          WebPFree(ptr);
        }
        lVar25 = lVar25 + 1;
      } while( true );
    }
  }
  Help();
  return 1;
code_r0x0010278f:
  uVar28 = uVar28 + 1;
  puVar16 = puVar16 + 1;
  goto LAB_00102785;
LAB_00103b59:
  if (lVar18 == 0x10) goto LAB_00103dfe;
  iVar6 = GetBits(pbVar27,uVar21,1,&bit,&bit_position_1);
  if ((iVar6 == 0) ||
     ((bit != 0 &&
      (iVar6 = GetSignedBits(pbVar27,uVar21,7,(int *)((long)&size + lVar18),&bit_position_1),
      iVar6 == 0)))) goto LAB_0010441d;
  lVar18 = lVar18 + 4;
  goto LAB_00103b59;
LAB_00103dfe:
  for (lVar18 = 0; lVar18 != 0x10; lVar18 = lVar18 + 4) {
    iVar6 = GetBits(pbVar27,uVar21,1,&bit,&bit_position_1);
    if ((iVar6 == 0) ||
       ((bit != 0 &&
        (iVar6 = GetSignedBits(pbVar27,uVar21,6,(int *)((long)filter_strength + lVar18),
                               &bit_position_1), iVar6 == 0)))) goto LAB_0010441d;
  }
  printf("  Quantizer:        %d %d %d %d\n",size & 0xffffffff,size >> 0x20,uStack_d0 & 0xffffffff,
         uStack_d0 >> 0x20);
  printf("  Filter strength:  %d %d %d %d\n",filter_strength._0_8_ & 0xffffffff,
         (ulong)filter_strength._0_8_ >> 0x20,filter_strength._8_8_ & 0xffffffff,
         (ulong)filter_strength._8_8_ >> 0x20);
LAB_00103eb5:
  if (iVar5 != 0) {
    size = 0xff000000ff;
    uStack_d0 = CONCAT44(uStack_d0._4_4_,0xff);
    for (lVar18 = 0; lVar18 != 0xc; lVar18 = lVar18 + 4) {
      iVar5 = GetBits(pbVar27,uVar21,1,filter_strength,&bit_position_1);
      if ((iVar5 == 0) ||
         ((filter_strength[0] != 0 &&
          (iVar5 = GetBits(pbVar27,uVar21,8,(int *)((long)&size + lVar18),&bit_position_1),
          iVar5 == 0)))) goto LAB_0010441d;
    }
    printf("  Prob segment:     %d %d %d\n",size & 0xffffffff,size >> 0x20,uStack_d0 & 0xffffffff);
  }
LAB_00103f64:
  iVar5 = GetBits(pbVar27,uVar21,1,(int *)&size,&bit_position_1);
  if ((((iVar5 == 0) ||
       (iVar5 = GetBits(pbVar27,uVar21,6,filter_strength,&bit_position_1), iVar5 == 0)) ||
      (iVar5 = GetBits(pbVar27,uVar21,3,&has_alpha,&bit_position_1), iVar5 == 0)) ||
     (iVar5 = GetBits(pbVar27,uVar21,1,&update_map,&bit_position_1), iVar5 == 0)) {
LAB_0010441d:
    if (webp_info.show_diagnosis_ != 0) {
LAB_0010442e:
      pcVar15 = "Truncated lossy bitstream.";
      goto LAB_00104446;
    }
  }
  else {
    printf("  Simple filter:    %d\n",size & 0xffffffff);
    printf("  Level:            %d\n",filter_strength._0_8_ & 0xffffffff);
    printf("  Sharpness:        %d\n",(ulong)(uint)has_alpha);
    iVar5 = update_map;
    printf("  Use lf delta:     %d\n",(ulong)(uint)update_map);
    if (iVar5 != 0) {
      iVar6 = GetBits(pbVar27,uVar21,1,&update_data,&bit_position_1);
      iVar5 = update_data;
      if (iVar6 != 0) {
        printf("  Update lf delta:  %d\n",(ulong)(uint)update_data);
        if (iVar5 == 0) goto LAB_001040d0;
        iVar5 = 8;
        do {
          bVar29 = iVar5 == 0;
          iVar5 = iVar5 + -1;
          if (bVar29) goto LAB_001040d0;
          iVar6 = GetBits(pbVar27,uVar21,1,&a_delta,&bit_position_1);
        } while ((iVar6 != 0) &&
                ((a_delta == 0 ||
                 (iVar6 = GetBits(pbVar27,uVar21,7,&a_delta,&bit_position_1), iVar6 != 0))));
      }
      goto LAB_0010441d;
    }
LAB_001040d0:
    iVar5 = GetBits(pbVar27,uVar21,2,(int *)&size,&bit_position_1);
    if (iVar5 != 0) {
      uVar23 = 1 << ((byte)size & 0x1f);
      iVar5 = (3 << ((byte)size & 0x1f)) + -3;
      if ((int)lVar19 < iVar5) goto LAB_0010410e;
      local_b0 = (uint3 *)(pbVar27 + uVar14);
      uVar28 = lVar19 - iVar5;
      printf("  Total partitions: %d\n",(ulong)uVar23);
      for (uVar20 = 1; (int)uVar20 < (int)uVar23; uVar20 = uVar20 + 1) {
        bVar29 = uVar28 < *local_b0;
        uVar28 = uVar28 - *local_b0;
        if (bVar29) {
          pcVar15 = "Truncated partition.";
          goto joined_r0x0010445e;
        }
        printf("  Part. %d length:   %d\n",(ulong)uVar20);
        local_b0 = (uint3 *)((long)local_b0 + 3);
      }
      has_alpha = 0;
      update_map = 0;
      update_data = 0;
      a_delta = 0;
      bit = 0;
      iVar5 = GetBits(pbVar27,uVar21,7,(int *)&size,&bit_position_1);
      if ((((((iVar5 == 0) ||
             (iVar5 = GetBits(pbVar27,uVar21,1,filter_strength,&bit_position_1), iVar5 == 0)) ||
            ((filter_strength[0] != 0 &&
             (iVar5 = GetSignedBits(pbVar27,uVar21,4,&has_alpha,&bit_position_1), iVar5 == 0)))) ||
           (iVar5 = GetBits(pbVar27,uVar21,1,filter_strength,&bit_position_1), iVar5 == 0)) ||
          (((filter_strength[0] != 0 &&
            (iVar5 = GetSignedBits(pbVar27,uVar21,4,&update_map,&bit_position_1), iVar5 == 0)) ||
           (iVar5 = GetBits(pbVar27,uVar21,1,filter_strength,&bit_position_1), iVar5 == 0)))) ||
         (((filter_strength[0] != 0 &&
           (iVar5 = GetSignedBits(pbVar27,uVar21,4,&update_data,&bit_position_1), iVar5 == 0)) ||
          (((iVar5 = GetBits(pbVar27,uVar21,1,filter_strength,&bit_position_1), iVar5 == 0 ||
            ((filter_strength[0] != 0 &&
             (iVar5 = GetSignedBits(pbVar27,uVar21,4,&a_delta,&bit_position_1), iVar5 == 0)))) ||
           (iVar5 = GetBits(pbVar27,uVar21,1,filter_strength,&bit_position_1), iVar5 == 0))))))
      goto LAB_0010441d;
      WVar9 = WEBP_INFO_OK;
      uVar28 = 0;
      if (filter_strength[0] != 0) {
        iVar5 = GetSignedBits(pbVar27,uVar21,4,&bit,&bit_position_1);
        if (iVar5 == 0) goto LAB_0010441d;
        uVar28 = (ulong)(uint)bit;
      }
      printf("  Base Q:           %d\n",size & 0xffffffff);
      printf("  DQ Y1 DC:         %d\n",(ulong)(uint)has_alpha);
      printf("  DQ Y2 DC:         %d\n",(ulong)(uint)update_map);
      printf("  DQ Y2 AC:         %d\n",(ulong)(uint)update_data);
      printf("  DQ UV DC:         %d\n",(ulong)(uint)a_delta);
      printf("  DQ UV AC:         %d\n",uVar28);
      if (bit_position_1 >> 3 < uVar14) goto LAB_00103d0a;
LAB_0010440a:
      WVar9 = WEBP_INFO_TRUNCATED_DATA;
      if (webp_info.show_diagnosis_ == 0) goto LAB_00103d0a;
      goto LAB_0010442e;
    }
LAB_0010410e:
    pcVar15 = "Truncated lossy bitstream.";
joined_r0x0010445e:
    if (webp_info.show_diagnosis_ == 0) goto LAB_00104427;
LAB_00104446:
    fprintf(_stderr,"Error: %s\n",pcVar15);
  }
LAB_00104427:
  WVar9 = WEBP_INFO_TRUNCATED_DATA;
LAB_00103d0a:
  uVar14 = local_180;
  if (WVar9 == WEBP_INFO_OK) {
LAB_00103d1c:
    WVar9 = WEBP_INFO_OK;
    uVar14 = local_180;
  }
LAB_0010321a:
  if ((uVar7 != 5) && (webp_info.is_processing_anim_frame_ != 0)) {
    sVar12 = webp_info.anim_frame_data_size_ - uVar14;
    if (sVar12 == 0) {
      if (webp_info.seen_image_subchunk_ == 0) {
        WVar9 = WEBP_INFO_PARSE_ERROR;
        if (webp_info.show_diagnosis_ != 0) {
          fprintf(_stderr,"Error: %s\n","No VP8/VP8L chunk detected in an ANMF chunk.");
          WVar9 = WEBP_INFO_PARSE_ERROR;
        }
      }
      else {
        webp_info._96_8_ = webp_info._96_8_ & 0xffffffff00000000;
      }
    }
    else if (webp_info.anim_frame_data_size_ < uVar14 || sVar12 == 0) {
      WVar9 = WEBP_INFO_TRUNCATED_DATA;
      if (webp_info.show_diagnosis_ != 0) {
        fprintf(_stderr,"Error: %s\n","Truncated data detected when parsing ANMF chunk.");
        WVar9 = WEBP_INFO_TRUNCATED_DATA;
      }
    }
    else {
      webp_info.anim_frame_data_size_ = sVar12;
    }
  }
  goto LAB_0010271a;
}

Assistant:

int main(int argc, const char* argv[]) {
  int c, quiet = 0, show_diag = 0, show_summary = 0;
  int parse_bitstream = 0;
  WebPInfoStatus webp_info_status = WEBP_INFO_OK;
  WebPInfo webp_info;

  INIT_WARGV(argc, argv);

  if (argc == 1) {
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  // Parse command-line input.
  for (c = 1; c < argc; ++c) {
    if (!strcmp(argv[c], "-h") || !strcmp(argv[c], "-help") ||
        !strcmp(argv[c], "-H") || !strcmp(argv[c], "-longhelp")) {
      Help();
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else if (!strcmp(argv[c], "-quiet")) {
      quiet = 1;
    } else if (!strcmp(argv[c], "-diag")) {
      show_diag = 1;
    } else if (!strcmp(argv[c], "-summary")) {
      show_summary = 1;
    } else if (!strcmp(argv[c], "-bitstream_info")) {
      parse_bitstream = 1;
    } else if (!strcmp(argv[c], "-version")) {
      const int version = WebPGetDecoderVersion();
      printf("WebP Decoder version: %d.%d.%d\n",
             (version >> 16) & 0xff, (version >> 8) & 0xff, version & 0xff);
      FREE_WARGV_AND_RETURN(EXIT_SUCCESS);
    } else {  // Assume the remaining are all input files.
      break;
    }
  }

  if (c == argc) {
    Help();
    FREE_WARGV_AND_RETURN(EXIT_FAILURE);
  }

  // Process input files one by one.
  for (; c < argc; ++c) {
    WebPData webp_data;
    const W_CHAR* in_file = NULL;
    WebPInfoInit(&webp_info);
    webp_info.quiet_ = quiet;
    webp_info.show_diagnosis_ = show_diag;
    webp_info.show_summary_ = show_summary;
    webp_info.parse_bitstream_ = parse_bitstream;
    in_file = GET_WARGV(argv, c);
    if (in_file == NULL ||
        !ReadFileToWebPData((const char*)in_file, &webp_data)) {
      webp_info_status = WEBP_INFO_INVALID_COMMAND;
      WFPRINTF(stderr, "Failed to open input file %s.\n", in_file);
      continue;
    }
    if (!webp_info.quiet_) WPRINTF("File: %s\n", in_file);
    webp_info_status = AnalyzeWebP(&webp_info, &webp_data);
    WebPDataClear(&webp_data);
  }
  FREE_WARGV_AND_RETURN((webp_info_status == WEBP_INFO_OK) ? EXIT_SUCCESS
                                                           : EXIT_FAILURE);
}